

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

bool __thiscall
fasttext::Dictionary::threshold::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,entry *e1,entry *e2)

{
  entry *e2_local;
  entry *e1_local;
  anon_class_1_0_00000001 *this_local;
  bool local_1;
  
  if (e1->type == e2->type) {
    local_1 = e2->count < e1->count;
  }
  else {
    local_1 = (char)e1->type < (char)e2->type;
  }
  return local_1;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}